

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec3 vec3_orthogonal(vec3 u)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  vec3 vVar9;
  
  fVar4 = u.z;
  fVar7 = u.x;
  fVar3 = u.y;
  fVar2 = fVar4 * fVar4 + fVar7 * fVar7 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar8 = 0.0;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar6 = fVar7 / fVar2;
    fVar8 = fVar3 / fVar2;
    fVar5 = fVar4 / fVar2;
  }
  fVar7 = ABS(fVar8);
  bVar1 = 0.0001 < ABS(fVar6 + -1.0);
  if ((!bVar1 && 0.0001 >= fVar7) && 0.0001 >= ABS(fVar5)) {
    fVar6 = 0.0;
    fVar8 = 1.0;
  }
  fVar2 = 0.0;
  if ((bVar1 || 0.0001 < fVar7) || 0.0001 < ABS(fVar5)) {
    fVar2 = fVar5;
  }
  vVar9.z = fVar6 * 0.0 - fVar8;
  vVar9.x = fVar8 * 0.0 + fVar2 * -0.0;
  vVar9.y = fVar2 - fVar6 * 0.0;
  return vVar9;
}

Assistant:

vec3 vec3_orthogonal(vec3 u) {
    u = vec3_normalize(u);
    vec3 v = V3(1.0f, 0.0f, 0.0f);
    if (vec3_equal(u, v)) {
        u = V3(0.0f, 1.0f, 0.0f);
    }
    return vec3_cross(u, v);
}